

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

uchar duckdb::Cast::Operation<unsigned_int,unsigned_char>(uint input)

{
  bool bVar1;
  InvalidInputException *this;
  uchar result;
  uint in_stack_000001ac;
  string *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  uchar local_5;
  
  bVar1 = TryCast::Operation<unsigned_int,unsigned_char>
                    ((uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                     (uint8_t *)in_stack_ffffffffffffffb8,false);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<unsigned_int,unsigned_char>(in_stack_000001ac);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffffb8);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_5;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}